

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_true,_false>::insert_branch_(DaTrie<true,_true,_false> *this,Query *query)

{
  pointer pBVar1;
  pointer pNVar2;
  uint32_t uVar3;
  byte bVar4;
  char *pcVar5;
  uint uVar6;
  uint node_pos;
  ulong uVar8;
  Edge local_138;
  ulong uVar7;
  
  uVar6 = SUB84((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start[query->node_pos_],0) & 0x7fffffff;
  uVar7 = (ulong)uVar6;
  pcVar5 = query->key_;
  uVar8 = (ulong)query->pos_;
  bVar4 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7];
  if (pcVar5[uVar8] == bVar4) {
    do {
      append_edge_(this,query);
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      uVar3 = this->tail_emps_ + 1;
      this->tail_emps_ = uVar3;
      pcVar5 = query->key_;
      uVar8 = (ulong)query->pos_;
      bVar4 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
    } while (pcVar5[uVar8] == bVar4);
  }
  else {
    uVar3 = this->tail_emps_;
  }
  this->tail_emps_ = uVar3 + 1;
  memset(&local_138,0,0x100);
  local_138.labels_[1] = pcVar5[uVar8];
  local_138.size_ = 2;
  local_138.labels_[0] = bVar4;
  uVar3 = xcheck_(this,&local_138,&this->blocks_);
  *(uint32_t *)
   ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
    super__Vector_impl_data._M_start + query->node_pos_) = uVar3 & 0x7fffffff;
  node_pos = uVar3 ^ bVar4;
  fix_(this,node_pos,&this->blocks_);
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1[node_pos] =
       (Bc)((ulong)pBVar1[node_pos] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  if (bVar4 == 0) {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[node_pos] =
         (Bc)((ulong)pBVar1[node_pos] & 0xffffffff00000000 |
              (ulong)*(uint *)((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl
                               .super__Vector_impl_data._M_start + (uVar6 + 1)) | 0x80000000);
    this->tail_emps_ = this->tail_emps_ + 4;
  }
  else {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[node_pos] =
         (Bc)((ulong)(uVar6 + 1 | 0x80000000) | (ulong)pBVar1[node_pos] & 0xffffffff00000000);
  }
  pNVar2 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar2[query->node_pos_].child = bVar4;
  pNVar2[node_pos].sib = bVar4;
  insert_edge_(this,query);
  return;
}

Assistant:

void insert_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());

    auto tail_pos = bc_[query.node_pos()].value();

    while (*query.key() == tail_[tail_pos]) {
      append_edge_(query);
      ++tail_pos;
      ++tail_emps_;
    }

    auto branch = static_cast<uint8_t>(tail_[tail_pos++]);
    ++tail_emps_;

    Edge edge;
    edge.push(branch);
    edge.push(query.label());

    auto base = xcheck_(edge, blocks_);
    bc_[query.node_pos()].set_base(base);

    auto child_pos = base ^branch;
    fix_(child_pos, blocks_);

    bc_[child_pos].set_check(query.node_pos());
    if (branch != '\0') {
      bc_[child_pos].set_value(tail_pos);
    } else {
      uint32_t value = 0;
      std::memcpy(&value, tail_.data() + tail_pos, sizeof(uint32_t));
      bc_[child_pos].set_value(value);
      tail_emps_ += sizeof(uint32_t);
    }

    if (WithNLM) {
      node_links_[query.node_pos()].child = branch;
      node_links_[child_pos].sib = branch;
    }
    insert_edge_(query);
  }